

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O3

size_t mtbdd_set_count(MTBDD set)

{
  size_t sVar1;
  
  sVar1 = 0;
  do {
    sVar1 = sVar1 + 1;
    set = set & 0x8000000000000000 ^
          *(ulong *)(nodes->data + (set & 0xffffffffff) * 0x10) & 0x800000ffffffffff;
  } while (set != 0x8000000000000000);
  return sVar1;
}

Assistant:

size_t
mtbdd_set_count(MTBDD set)
{
    size_t result = 0;
    while (set != mtbdd_true) {
        result++;
        set = mtbdd_gethigh(set);
    }
    return result;
}